

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O1

peer_class_info * __thiscall
libtorrent::session_handle::
sync_call_ret<libtorrent::peer_class_info,libtorrent::peer_class_info(libtorrent::aux::session_impl::*)(libtorrent::aux::strong_typedef<unsigned_int,libtorrent::peer_class_tag,void>)const,libtorrent::aux::strong_typedef<unsigned_int,libtorrent::peer_class_tag,void>&>
          (peer_class_info *__return_storage_ptr__,session_handle *this,
          offset_in_session_impl_to_subr f,
          strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> *a)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  session_impl *ses;
  pointer pcVar3;
  int iVar4;
  undefined8 uVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint *in_R8;
  bool bVar6;
  bool done;
  exception_ptr ex;
  bool local_81;
  exception_ptr local_80;
  void *local_78;
  undefined1 local_70 [56];
  bitfield_flag<unsigned_int,_libtorrent::save_state_flags_tag,_void> local_38;
  io_context *local_30;
  undefined4 local_24;
  
  this_00 = (this->m_impl).
            super___weak_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar4 = this_00->_M_use_count;
    do {
      if (iVar4 == 0) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar2 = this_00->_M_use_count;
      bVar6 = iVar4 == iVar2;
      if (bVar6) {
        this_00->_M_use_count = iVar4 + 1;
        iVar2 = iVar4;
      }
      iVar4 = iVar2;
      UNLOCK();
    } while (!bVar6);
  }
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar6 = true;
  }
  else {
    bVar6 = this_00->_M_use_count == 0;
  }
  if ((bVar6) ||
     (ses = (this->m_impl).
            super___weak_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     ses == (session_impl *)0x0)) {
    local_70._0_4_ = 0x73;
    aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
              ((error_code_enum *)local_70);
  }
  paVar1 = &(__return_storage_ptr__->label).field_2;
  local_70._8_8_ = &local_81;
  local_81 = false;
  (__return_storage_ptr__->label)._M_dataplus._M_p = (pointer)paVar1;
  (__return_storage_ptr__->label)._M_string_length = 0;
  (__return_storage_ptr__->label).field_2._M_local_buf[0] = '\0';
  local_70._16_8_ = &local_80;
  local_80._M_exception_object = (void *)0x0;
  local_30 = ses->m_io_context;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_38.m_val = *in_R8;
  local_24 = 0;
  local_70._0_8_ = __return_storage_ptr__;
  local_70._24_8_ = ses;
  local_70._32_8_ = this_00;
  local_70._40_8_ = f;
  local_70._48_8_ = a;
  boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>::
  execute<libtorrent::session_handle::sync_call_ret<libtorrent::peer_class_info,libtorrent::peer_class_info(libtorrent::aux::session_impl::*)(libtorrent::aux::strong_typedef<unsigned_int,libtorrent::peer_class_tag,void>)const,libtorrent::aux::strong_typedef<unsigned_int,libtorrent::peer_class_tag,void>&>(libtorrent::peer_class_info(libtorrent::aux::session_impl::*)(libtorrent::aux::strong_typedef<unsigned_int,libtorrent::peer_class_tag,void>)const,libtorrent::aux::strong_typedef<unsigned_int,libtorrent::peer_class_tag,void>&)const::_lambda()_1_>
            ((basic_executor_type<std::allocator<void>,0u> *)&local_30,(type *)local_70);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._32_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._32_8_);
  }
  aux::torrent_wait(&local_81,ses);
  if (local_80._M_exception_object != (void *)0x0) {
    local_78 = local_80._M_exception_object;
    ::std::__exception_ptr::exception_ptr::_M_addref();
    uVar5 = ::std::rethrow_exception((exception_ptr)&local_78);
    if (local_78 != (void *)0x0) {
      ::std::__exception_ptr::exception_ptr::_M_release();
    }
    if (local_80._M_exception_object != (void *)0x0) {
      ::std::__exception_ptr::exception_ptr::_M_release();
    }
    pcVar3 = (__return_storage_ptr__->label)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    _Unwind_Resume(uVar5);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

Ret session_handle::sync_call_ret(Fun f, Args&&... a) const
	{
		std::shared_ptr<session_impl> s = m_impl.lock();
		if (!s) aux::throw_ex<system_error>(errors::invalid_session_handle);

		// this is the flag to indicate the call has completed
		// capture them by pointer to allow everything to be captured by value
		// and simplify the capture expression
		bool done = false;
		Ret r;
		std::exception_ptr ex;
		dispatch(s->get_context(), [=, &r, &done, &ex]() mutable
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				r = (s.get()->*f)(std::forward<Args>(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (...) {
				ex = std::current_exception();
			}
#endif
			std::unique_lock<std::mutex> l(s->mut);
			done = true;
			s->cond.notify_all();
		});

		aux::torrent_wait(done, *s);
		if (ex) std::rethrow_exception(ex);
		return r;
	}